

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_request_state(Curl_easy *data,_Bool *done)

{
  curl_off_t *pcVar1;
  connectdata *conn_00;
  smb_request *psVar2;
  curl_off_t cVar3;
  FILEPROTO *pFVar4;
  char *pcVar5;
  connectdata *pcVar6;
  void *pvVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  CURLcode CVar10;
  int iVar11;
  CURLcode CVar12;
  uint uVar13;
  __pid_t _Var14;
  size_t sVar15;
  size_t sVar16;
  curl_pp_transfer cVar17;
  ulong blen;
  size_t sVar18;
  connectdata *conn;
  uchar cmd;
  long lVar19;
  short sVar20;
  bool bVar21;
  void *msg;
  smb_tree_disconnect msg_1;
  void *local_478;
  long local_470;
  undefined1 local_468;
  undefined1 uStack_467;
  undefined1 uStack_466;
  undefined2 uStack_465;
  undefined1 uStack_463;
  undefined1 uStack_462;
  undefined1 uStack_461;
  undefined1 uStack_460;
  short sStack_45f;
  undefined2 uStack_45d;
  char acStack_45b [2];
  uint uStack_459;
  undefined1 uStack_455;
  undefined1 uStack_454;
  undefined4 local_453;
  undefined2 uStack_44f;
  char acStack_448 [4];
  int iStack_444;
  short sStack_437;
  char acStack_435 [1029];
  
  conn_00 = data->conn;
  psVar2 = (data->req).p.smb;
  local_478 = (void *)0x0;
  if ((((data->state).field_0x74e & 0x10) != 0) && ((data->state).infilesize < 0)) {
    Curl_failf(data,"SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }
  if (psVar2->state == SMB_REQUESTING) {
    sVar15 = strlen((conn_00->host).name);
    sVar16 = strlen((conn_00->proto).smbc.share);
    CVar10 = CURLE_FILESIZE_EXCEEDED;
    if (0xfffffffffffffbfe < (sVar16 + sVar15) - 0x3f7) {
      memset(&local_468,0,0x40b);
      local_468 = 4;
      uStack_467 = 0xff;
      uStack_461 = 0;
      uStack_460 = 0;
      uStack_45d = 0x5c5c;
      acStack_45b[0] = '\0';
      strcpy(acStack_45b,(conn_00->host).name);
      sVar15 = strlen((conn_00->host).name);
      (acStack_45b + sVar15)[0] = '\\';
      (acStack_45b + sVar15)[1] = '\0';
      strcpy(acStack_45b + sVar15 + 1,(conn_00->proto).smbc.share);
      sVar16 = strlen((conn_00->proto).smbc.share);
      lVar19 = sVar16 + sVar15;
      *(undefined4 *)((long)&uStack_459 + lVar19) = 0x3f3f3f3f;
      *(undefined2 *)(&uStack_455 + lVar19) = 0x3f;
      sStack_45f = (short)(acStack_45b + (lVar19 - (long)&uStack_45d) + 1) + 7;
      CVar10 = smb_send_message(data,'u',&local_468,
                                (size_t)(acStack_45b + (lVar19 - (long)&uStack_45d) + 1 + 0x12));
    }
    if (CVar10 != CURLE_OK) goto LAB_006b2975;
    ((data->req).p.imap)->transfer = PPTRANSFER_INFO;
  }
  CVar10 = smb_send_and_recv(data,&local_478);
  pvVar7 = local_478;
  if ((CVar10 != CURLE_OK) && (CVar10 != CURLE_AGAIN)) {
LAB_006b2975:
    Curl_conncontrol(conn_00,1);
    return CVar10;
  }
  CVar10 = CURLE_OK;
  if (local_478 == (void *)0x0) {
    return CURLE_OK;
  }
  switch(psVar2->state) {
  case SMB_TREE_CONNECT:
    if (*(int *)((long)local_478 + 9) != 0) {
      CVar12 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (*(int *)((long)local_478 + 9) == 0x50001) {
        CVar12 = CURLE_REMOTE_ACCESS_DENIED;
      }
      psVar2->result = CVar12;
      (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
      goto LAB_006b3070;
    }
    psVar2->tid = *(unsigned_short *)((long)local_478 + 0x1c);
    (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
    cVar17 = PPTRANSFER_NONE;
    pFVar4 = (data->req).p.file;
    sVar15 = strlen(pFVar4->freepath);
    CVar12 = CURLE_FILESIZE_EXCEEDED;
    if (sVar15 - 0x400 < 0xfffffffffffffbff) goto LAB_006b3038;
    memset(&local_468,0,0x433);
    local_468 = 0x18;
    uStack_467 = 0xff;
    pcVar5 = pFVar4->freepath;
    sVar15 = strlen(pcVar5);
    uStack_462 = (undefined1)sVar15;
    uStack_461 = (undefined1)(sVar15 >> 8);
    acStack_448[0] = '\a';
    acStack_448[1] = '\0';
    acStack_448[2] = '\0';
    acStack_448[3] = '\0';
    uVar13 = *(uint *)&(data->state).field_0x74c >> 0x14 & 1;
    iStack_444 = uVar13 * 4 + 1;
    uStack_459 = (uint)(byte)uStack_459;
    uStack_455 = (undefined1)((uVar13 - 2) * 0x40000000 >> 0x18);
    sStack_437 = (short)sVar15 + 1;
    strcpy(acStack_435,pcVar5);
    sVar18 = sVar15 + 0x34;
    cmd = 0xa2;
    break;
  case SMB_OPEN:
    if ((*(int *)((long)local_478 + 9) == 0) && (99 < (conn_00->proto).ftpc.pp.sendbuf.allc)) {
      psVar2->fid = *(unsigned_short *)((long)local_478 + 0x2a);
      (data->req).offset = 0;
      if (((data->state).field_0x74e & 0x10) != 0) {
        cVar3 = (data->state).infilesize;
        (data->req).size = cVar3;
        Curl_pgrsSetUploadSize(data,cVar3);
        (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
        cVar17 = 4;
switchD_006b2c05_caseD_1:
        psVar2 = (data->req).p.smb;
        cVar3 = (data->req).offset;
        lVar19 = (data->req).size;
        local_470 = (data->req).bytecount;
        CVar12 = Curl_get_upload_buffer(data);
        if (CVar12 == CURLE_OK) {
          sVar18 = lVar19 - local_470;
          pcVar5 = (data->state).ulbuf;
          if (0x7ffe < (long)sVar18) {
            sVar18 = 0x7fff;
          }
          pcVar5[0x20] = '\0';
          pcVar5[0x21] = '\0';
          pcVar5[0x22] = '\0';
          pcVar5[0x23] = '\0';
          pcVar5[0x24] = '\0';
          pcVar5[0x25] = '\0';
          pcVar5[0x26] = '\0';
          pcVar5[0x27] = '\0';
          pcVar5[0x28] = '\0';
          pcVar5[0x29] = '\0';
          pcVar5[0x2a] = '\0';
          pcVar5[0x2b] = '\0';
          pcVar5[0x2c] = '\0';
          pcVar5[0x2d] = '\0';
          pcVar5[0x2e] = '\0';
          pcVar5[0x2f] = '\0';
          pcVar5[0x40] = '\0';
          pcVar5[0x41] = '\0';
          pcVar5[0x42] = '\0';
          pcVar5[0x43] = '\0';
          pcVar5[0x30] = '\0';
          pcVar5[0x31] = '\0';
          pcVar5[0x32] = '\0';
          pcVar5[0x33] = '\0';
          pcVar5[0x34] = '\0';
          pcVar5[0x35] = '\0';
          pcVar5[0x36] = '\0';
          pcVar5[0x37] = '\0';
          pcVar5[0x38] = '\0';
          pcVar5[0x39] = '\0';
          pcVar5[0x3a] = '\0';
          pcVar5[0x3b] = '\0';
          pcVar5[0x3c] = '\0';
          pcVar5[0x3d] = '\0';
          pcVar5[0x3e] = '\0';
          pcVar5[0x3f] = '\0';
          pcVar5[0x10] = '\0';
          pcVar5[0x11] = '\0';
          pcVar5[0x12] = '\0';
          pcVar5[0x13] = '\0';
          pcVar5[0x14] = '\0';
          pcVar5[0x15] = '\0';
          pcVar5[0x16] = '\0';
          pcVar5[0x17] = '\0';
          pcVar5[0x18] = '\0';
          pcVar5[0x19] = '\0';
          pcVar5[0x1a] = '\0';
          pcVar5[0x1b] = '\0';
          pcVar5[0x1c] = '\0';
          pcVar5[0x1d] = '\0';
          pcVar5[0x1e] = '\0';
          pcVar5[0x1f] = '\0';
          pcVar5[0] = '\0';
          pcVar5[1] = '\0';
          pcVar5[2] = '\0';
          pcVar5[3] = '\0';
          pcVar5[4] = '\0';
          pcVar5[5] = '\0';
          pcVar5[6] = '\0';
          pcVar5[7] = '\0';
          pcVar5[8] = '\0';
          pcVar5[9] = '\0';
          pcVar5[10] = '\0';
          pcVar5[0xb] = '\0';
          pcVar5[0xc] = '\0';
          pcVar5[0xd] = '\0';
          pcVar5[0xe] = '\0';
          pcVar5[0xf] = '\0';
          pcVar5[0x24] = '\x0e';
          pcVar5[0x25] = -1;
          *(unsigned_short *)(pcVar5 + 0x29) = psVar2->fid;
          *(int *)(pcVar5 + 0x2b) = (int)cVar3;
          *(int *)(pcVar5 + 0x3d) = (int)((ulong)cVar3 >> 0x20);
          sVar20 = (short)sVar18;
          *(short *)(pcVar5 + 0x39) = sVar20;
          pcVar5[0x3b] = '@';
          pcVar5[0x3c] = '\0';
          *(short *)(pcVar5 + 0x41) = sVar20 + 1;
          pcVar6 = data->conn;
          psVar2 = (data->req).p.smb;
          pcVar5[0] = '\0';
          pcVar5[1] = '\0';
          pcVar5[2] = '\0';
          pcVar5[3] = '\0';
          pcVar5[4] = '\0';
          pcVar5[5] = '\0';
          pcVar5[6] = '\0';
          pcVar5[7] = '\0';
          pcVar5[8] = '\0';
          pcVar5[9] = '\0';
          pcVar5[10] = '\0';
          pcVar5[0xb] = '\0';
          pcVar5[0xc] = '\0';
          pcVar5[0xd] = '\0';
          pcVar5[0xe] = '\0';
          pcVar5[0xf] = '\0';
          pcVar5[0x20] = '\0';
          pcVar5[0x21] = '\0';
          pcVar5[0x22] = '\0';
          pcVar5[0x23] = '\0';
          pcVar5[0x10] = '\0';
          pcVar5[0x11] = '\0';
          pcVar5[0x12] = '\0';
          pcVar5[0x13] = '\0';
          pcVar5[0x14] = '\0';
          pcVar5[0x15] = '\0';
          pcVar5[0x16] = '\0';
          pcVar5[0x17] = '\0';
          pcVar5[0x18] = '\0';
          pcVar5[0x19] = '\0';
          pcVar5[0x1a] = '\0';
          pcVar5[0x1b] = '\0';
          pcVar5[0x1c] = '\0';
          pcVar5[0x1d] = '\0';
          pcVar5[0x1e] = '\0';
          pcVar5[0x1f] = '\0';
          *(ushort *)(pcVar5 + 2) = (sVar20 + 0x40U) * 0x100 | (ushort)(sVar20 + 0x40U) >> 8;
          pcVar5[4] = -1;
          pcVar5[5] = 'S';
          pcVar5[6] = 'M';
          pcVar5[7] = 'B';
          pcVar5[8] = '/';
          pcVar5[0xd] = '\x18';
          pcVar5[0xe] = 'A';
          pcVar5[0xf] = '\0';
          *(unsigned_short *)(pcVar5 + 0x20) = (pcVar6->proto).smbc.uid;
          *(unsigned_short *)(pcVar5 + 0x1c) = psVar2->tid;
          _Var14 = getpid();
          *(short *)(pcVar5 + 0x10) = (short)((uint)_Var14 >> 0x10);
          *(short *)(pcVar5 + 0x1e) = (short)_Var14;
          CVar12 = smb_send(data,0x44,sVar18);
        }
        goto LAB_006b3038;
      }
      lVar19 = *(long *)((long)local_478 + 0x5c);
      (data->req).size = lVar19;
      if (lVar19 < 0) {
        psVar2->result = CURLE_WEIRD_SERVER_REPLY;
        (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
        cVar17 = 5;
        goto switchD_006b2c05_caseD_0;
      }
      Curl_pgrsSetDownloadSize(data,lVar19);
      iVar11 = 3;
      if (((data->set).field_0x8ba & 0x80) == 0) goto LAB_006b29b9;
      (data->info).filetime = (*(long *)((long)pvVar7 + 0x48) + -0x19db1ded53e8000) / 10000000;
      (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
      cVar17 = PPTRANSFER_NONE|PPTRANSFER_INFO;
switchD_006b2d82_caseD_0:
      cVar3 = (data->req).offset;
      uStack_466 = 0;
      uStack_465 = 0;
      uStack_459 = 0;
      uStack_455 = 0;
      uStack_454 = 0;
      uStack_44f = 0;
      local_468 = 0xc;
      uStack_467 = 0xff;
      uVar9 = ((data->req).p.smb)->fid;
      uStack_463 = (undefined1)uVar9;
      uStack_462 = (undefined1)(uVar9 >> 8);
      uStack_461 = (undefined1)cVar3;
      uStack_460 = (undefined1)((ulong)cVar3 >> 8);
      sStack_45f = (short)((ulong)cVar3 >> 0x10);
      local_453 = (undefined4)((ulong)cVar3 >> 0x20);
      uStack_45d = 0x8000;
      acStack_45b[0] = '\0';
      acStack_45b[1] = 0x80;
      sVar18 = 0x1b;
      cmd = '.';
    }
    else {
      CVar12 = CURLE_REMOTE_FILE_NOT_FOUND;
      if (*(int *)((long)local_478 + 9) == 0x50001) {
        CVar12 = CURLE_REMOTE_ACCESS_DENIED;
      }
      psVar2->result = CVar12;
      (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
      cVar17 = 6;
      uStack_466 = 0;
      local_468 = 0;
      uStack_467 = 0;
      sVar18 = 3;
      cmd = 'q';
    }
    break;
  case SMB_DOWNLOAD:
    if ((*(int *)((long)local_478 + 9) == 0) && (0x31 < (conn_00->proto).ftpc.pp.sendbuf.allc)) {
      uVar9 = Curl_read16_le((uchar *)((long)local_478 + 0x2f));
      uVar8 = Curl_read16_le((uchar *)((long)pvVar7 + 0x31));
      blen = (ulong)uVar9;
      if (uVar9 != 0) {
        if ((conn_00->proto).ftpc.pp.sendbuf.allc < blen + uVar8 + 4) {
          Curl_failf(data,"Invalid input packet");
          CVar12 = CURLE_RECV_ERROR;
        }
        else {
          CVar12 = Curl_client_write(data,1,(char *)((long)pvVar7 + (ulong)uVar8 + 4),blen);
        }
        if (CVar12 != CURLE_OK) {
          psVar2->result = CVar12;
          (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
          cVar17 = 5;
          goto switchD_006b2c05_caseD_0;
        }
      }
      pcVar1 = &(data->req).offset;
      *pcVar1 = *pcVar1 + blen;
      bVar21 = -1 < (short)uVar9;
      cVar17 = bVar21 + 3 + (uint)bVar21;
      (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
      switch(bVar21) {
      case false:
        goto switchD_006b2d82_caseD_0;
      }
    }
    else {
      psVar2->result = CURLE_RECV_ERROR;
      (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
      cVar17 = 5;
    }
    goto switchD_006b2c05_caseD_0;
  case SMB_UPLOAD:
    if ((*(int *)((long)local_478 + 9) == 0) && (0x29 < (conn_00->proto).ftpc.pp.sendbuf.allc)) {
      uVar9 = Curl_read16_le((uchar *)((long)local_478 + 0x29));
      lVar19 = (data->req).bytecount + (ulong)uVar9;
      (data->req).bytecount = lVar19;
      pcVar1 = &(data->req).offset;
      *pcVar1 = *pcVar1 + (ulong)uVar9;
      Curl_pgrsSetUploadCounter(data,lVar19);
      bVar21 = (data->req).bytecount < (data->req).size;
      cVar17 = bVar21 ^ 5;
      (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
      switch(bVar21) {
      case true:
        goto switchD_006b2c05_caseD_1;
      }
    }
    else {
      psVar2->result = CURLE_UPLOAD_FAILED;
      (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
      cVar17 = 5;
    }
switchD_006b2c05_caseD_0:
    uStack_465 = 0;
    uStack_463 = 0;
    uStack_462 = 0;
    uStack_461 = 0;
    uStack_460 = 0;
    local_468 = 3;
    uVar9 = ((data->req).p.smb)->fid;
    uStack_467 = (undefined1)uVar9;
    uStack_466 = (undefined1)(uVar9 >> 8);
    sVar18 = 9;
    cmd = '\x04';
    break;
  case SMB_CLOSE:
    iVar11 = 6;
LAB_006b29b9:
    (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
    CVar10 = (*(code *)((long)&DAT_00907b0c + (long)(int)(&DAT_00907b0c)[iVar11 - 2]))();
    return CVar10;
  case SMB_TREE_DISCONNECT:
    (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
LAB_006b3070:
    cVar17 = 7;
    CVar12 = psVar2->result;
    *done = true;
    goto LAB_006b3038;
  default:
    (conn_00->proto).ftpc.pp.sendbuf.allc = 0;
    return CURLE_OK;
  }
  CVar12 = smb_send_message(data,cmd,&local_468,sVar18);
LAB_006b3038:
  if (CVar12 == CURLE_OK) {
    ((data->req).p.imap)->transfer = cVar17;
  }
  else {
    Curl_conncontrol(conn_00,1);
    CVar10 = CVar12;
  }
  return CVar10;
}

Assistant:

static CURLcode smb_request_state(struct Curl_easy *data, bool *done)
{
  struct connectdata *conn = data->conn;
  struct smb_request *req = data->req.p.smb;
  struct smb_header *h;
  struct smb_conn *smbc = &conn->proto.smbc;
  enum smb_req_state next_state = SMB_DONE;
  unsigned short len;
  unsigned short off;
  CURLcode result;
  void *msg = NULL;
  const struct smb_nt_create_response *smb_m;

  if(data->state.upload && (data->state.infilesize < 0)) {
    failf(data, "SMB upload needs to know the size up front");
    return CURLE_SEND_ERROR;
  }

  /* Start the request */
  if(req->state == SMB_REQUESTING) {
    result = smb_send_tree_connect(data);
    if(result) {
      connclose(conn, "SMB: failed to send tree connect message");
      return result;
    }

    request_state(data, SMB_TREE_CONNECT);
  }

  /* Send the previous message and check for a response */
  result = smb_send_and_recv(data, &msg);
  if(result && result != CURLE_AGAIN) {
    connclose(conn, "SMB: failed to communicate");
    return result;
  }

  if(!msg)
    return CURLE_OK;

  h = msg;

  switch(req->state) {
  case SMB_TREE_CONNECT:
    if(h->status) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      break;
    }
    req->tid = smb_swap16(h->tid);
    next_state = SMB_OPEN;
    break;

  case SMB_OPEN:
    if(h->status || smbc->got < sizeof(struct smb_nt_create_response)) {
      req->result = CURLE_REMOTE_FILE_NOT_FOUND;
      if(h->status == smb_swap32(SMB_ERR_NOACCESS))
        req->result = CURLE_REMOTE_ACCESS_DENIED;
      next_state = SMB_TREE_DISCONNECT;
      break;
    }
    smb_m = (const struct smb_nt_create_response*) msg;
    req->fid = smb_swap16(smb_m->fid);
    data->req.offset = 0;
    if(data->state.upload) {
      data->req.size = data->state.infilesize;
      Curl_pgrsSetUploadSize(data, data->req.size);
      next_state = SMB_UPLOAD;
    }
    else {
      data->req.size = smb_swap64(smb_m->end_of_file);
      if(data->req.size < 0) {
        req->result = CURLE_WEIRD_SERVER_REPLY;
        next_state = SMB_CLOSE;
      }
      else {
        Curl_pgrsSetDownloadSize(data, data->req.size);
        if(data->set.get_filetime)
          get_posix_time(&data->info.filetime, smb_m->last_change_time);
        next_state = SMB_DOWNLOAD;
      }
    }
    break;

  case SMB_DOWNLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 14) {
      req->result = CURLE_RECV_ERROR;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 11);
    off = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 13);
    if(len > 0) {
      if(off + sizeof(unsigned int) + len > smbc->got) {
        failf(data, "Invalid input packet");
        result = CURLE_RECV_ERROR;
      }
      else
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   (char *)msg + off + sizeof(unsigned int),
                                   len);
      if(result) {
        req->result = result;
        next_state = SMB_CLOSE;
        break;
      }
    }
    data->req.offset += len;
    next_state = (len < MAX_PAYLOAD_SIZE) ? SMB_CLOSE : SMB_DOWNLOAD;
    break;

  case SMB_UPLOAD:
    if(h->status || smbc->got < sizeof(struct smb_header) + 6) {
      req->result = CURLE_UPLOAD_FAILED;
      next_state = SMB_CLOSE;
      break;
    }
    len = Curl_read16_le(((const unsigned char *) msg) +
                         sizeof(struct smb_header) + 5);
    data->req.bytecount += len;
    data->req.offset += len;
    Curl_pgrsSetUploadCounter(data, data->req.bytecount);
    if(data->req.bytecount >= data->req.size)
      next_state = SMB_CLOSE;
    else
      next_state = SMB_UPLOAD;
    break;

  case SMB_CLOSE:
    /* We don't care if the close failed, proceed to tree disconnect anyway */
    next_state = SMB_TREE_DISCONNECT;
    break;

  case SMB_TREE_DISCONNECT:
    next_state = SMB_DONE;
    break;

  default:
    smb_pop_message(conn);
    return CURLE_OK; /* ignore */
  }

  smb_pop_message(conn);

  switch(next_state) {
  case SMB_OPEN:
    result = smb_send_open(data);
    break;

  case SMB_DOWNLOAD:
    result = smb_send_read(data);
    break;

  case SMB_UPLOAD:
    result = smb_send_write(data);
    break;

  case SMB_CLOSE:
    result = smb_send_close(data);
    break;

  case SMB_TREE_DISCONNECT:
    result = smb_send_tree_disconnect(data);
    break;

  case SMB_DONE:
    result = req->result;
    *done = true;
    break;

  default:
    break;
  }

  if(result) {
    connclose(conn, "SMB: failed to send message");
    return result;
  }

  request_state(data, next_state);

  return CURLE_OK;
}